

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blkarray_list.c
# Opt level: O2

void blkarray_list_reset(blkarray_list_t *bl)

{
  int32 i;
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  while( true ) {
    lVar2 = (long)bl->cur_row;
    if (lVar2 <= lVar1) break;
    for (lVar2 = 0; lVar2 < bl->blksize; lVar2 = lVar2 + 1) {
      ckd_free(bl->ptr[lVar1][lVar2]);
    }
    ckd_free(bl->ptr[lVar1]);
    bl->ptr[lVar1] = (void **)0x0;
    lVar1 = lVar1 + 1;
  }
  if (bl->cur_row == (int)lVar1) {
    for (lVar1 = 0; lVar1 < bl->cur_row_free; lVar1 = lVar1 + 1) {
      ckd_free(bl->ptr[lVar2][lVar1]);
    }
    ckd_free(bl->ptr[lVar2]);
    bl->ptr[lVar2] = (void **)0x0;
  }
  bl->n_valid = 0;
  bl->cur_row = -1;
  bl->cur_row_free = bl->blksize;
  return;
}

Assistant:

void
blkarray_list_reset(blkarray_list_t * bl)
{
    int32 i, j;

    /* Free all the allocated elements as well as the blocks */
    for (i = 0; i < bl->cur_row; i++) {
        for (j = 0; j < bl->blksize; j++)
            ckd_free(bl->ptr[i][j]);

        ckd_free(bl->ptr[i]);
        bl->ptr[i] = NULL;
    }
    if (i == bl->cur_row) {     /* NEED THIS! (in case cur_row < 0) */
        for (j = 0; j < bl->cur_row_free; j++)
            ckd_free(bl->ptr[i][j]);

        ckd_free(bl->ptr[i]);
        bl->ptr[i] = NULL;
    }

    bl->n_valid = 0;
    bl->cur_row = -1;
    bl->cur_row_free = bl->blksize;
}